

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport_cTest.cpp
# Opt level: O0

void __thiscall
TEST_MockSupport_c_hasReturnValue_Test::~TEST_MockSupport_c_hasReturnValue_Test
          (TEST_MockSupport_c_hasReturnValue_Test *this)

{
  TEST_MockSupport_c_hasReturnValue_Test *this_local;
  
  ~TEST_MockSupport_c_hasReturnValue_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockSupport_c, hasReturnValue)
{
    mock_c()->expectOneCall("foo");
    CHECK(mock_c()->actualCall("foo")->hasReturnValue() == 0);
    CHECK(mock_c()->hasReturnValue() == 0);

    mock_c()->expectOneCall("foo2")->andReturnIntValue(1);
    CHECK(mock_c()->actualCall("foo2")->hasReturnValue() != 0);
    CHECK(mock_c()->hasReturnValue() != 0);
}